

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O1

REF_STATUS
ref_part_plt_data(FILE *file,REF_INT nvar,REF_LIST zone_type,REF_LIST zone_packing,
                 REF_LIST zone_nnode,REF_LIST zone_nelem,REF_INT *length,REF_DBL **soln)

{
  undefined4 uVar1;
  REF_LIST pRVar2;
  REF_LIST pRVar3;
  int iVar4;
  undefined4 uVar5;
  uint uVar6;
  uint uVar7;
  size_t sVar8;
  REF_DBL *pRVar9;
  undefined8 uVar10;
  char *pcVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  FILE *__stream;
  long lVar15;
  double dVar16;
  REF_INT nnode;
  float var_float;
  int sharing;
  int passive;
  REF_INT nelem;
  REF_LIST dataformats;
  double var_double;
  REF_INT packing;
  REF_INT zonetype;
  int conn;
  float zonemarker;
  int c2n;
  double maxval;
  double minval;
  uint local_b4;
  FILE *local_b0;
  REF_INT local_a8;
  float local_a4;
  int local_a0;
  int local_9c;
  ulong local_98;
  long local_90;
  int local_84;
  REF_LIST local_80;
  ulong local_78;
  double local_70;
  int local_68;
  int local_64;
  int local_60;
  float local_5c;
  REF_LIST local_58;
  undefined8 uStack_50;
  undefined1 local_44 [4];
  undefined1 local_40 [8];
  undefined1 local_38 [8];
  
  local_80 = (REF_LIST)0x0;
  local_58 = zone_nelem;
  uVar6 = ref_list_create(&local_80);
  if (uVar6 == 0) {
    local_b0 = (FILE *)file;
    uVar6 = ref_list_shift(zone_type,&local_64);
    if (uVar6 == 0) {
      uVar6 = ref_list_shift(zone_packing,&local_68);
      if (uVar6 == 0) {
        uVar6 = ref_list_shift(zone_nnode,&local_a8);
        if (uVar6 == 0) {
          uVar6 = ref_list_shift(local_58,&local_84);
          __stream = local_b0;
          if (uVar6 == 0) {
            if (local_64 - 1U < 5) {
              uVar1 = *(undefined4 *)(&DAT_0021f0d8 + (ulong)(local_64 - 1U) * 4);
              *length = local_a8;
              sVar8 = fread(&local_5c,4,1,local_b0);
              if (sVar8 != 1) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0x999,"ref_part_plt_data","zonemarker",1,sVar8);
                return 1;
              }
              pRVar2 = (REF_LIST)(299.0 - (double)local_5c);
              if ((double)pRVar2 <= -(double)pRVar2) {
                pRVar2 = (REF_LIST)-(double)pRVar2;
              }
              pRVar3 = pRVar2;
              if (2.99e-10 < (double)pRVar2) {
                uStack_50 = 0;
                local_58._0_4_ = (int)pRVar2;
                uVar5 = (int)local_58;
                local_58 = pRVar2;
                printf("%s: %d: %s: %s\nexpected %.15e, was %.15e, %e outside of %e\n",
                       0x4072b00000000000,(double)local_5c,uVar5,0x3df48c1049e0a062,
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0x99a,"ref_part_plt_data","start of data header expected");
                pRVar3 = local_58;
              }
              uVar6 = (uint)(2.99e-10 < (double)pRVar2);
              if (2.99e-10 < (double)pRVar3) {
                return uVar6;
              }
              local_58 = (REF_LIST)CONCAT44(local_58._4_4_,uVar1);
              iVar14 = nvar;
              if (0 < nvar) {
                do {
                  sVar8 = fread(&local_b4,4,1,__stream);
                  if (sVar8 != 1) {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0x99d,"ref_part_plt_data","dim",1,sVar8);
                    return 1;
                  }
                  uVar7 = ref_list_push(local_80,local_b4);
                  if (uVar7 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0x99e,"ref_part_plt_data",(ulong)uVar7,"save dataformat");
                    return uVar7;
                  }
                  iVar14 = iVar14 + -1;
                  __stream = local_b0;
                } while (iVar14 != 0);
              }
              sVar8 = fread(&local_9c,4,1,__stream);
              if (sVar8 != 1) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0x9a0,"ref_part_plt_data","dim",1,sVar8);
                return 1;
              }
              iVar14 = nvar;
              if (0 < nvar && local_9c == 1) {
                do {
                  sVar8 = fread(&local_9c,4,1,local_b0);
                  iVar4 = local_9c;
                  if (sVar8 != 1) {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0x9a3,"ref_part_plt_data","dim",1,sVar8);
                    return 1;
                  }
                  if ((long)local_9c != 0) {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0x9a4,"ref_part_plt_data","passive variable nonzero plt",0,
                           (long)local_9c);
                    uVar6 = 1;
                  }
                  if (iVar4 != 0) {
                    return uVar6;
                  }
                  iVar14 = iVar14 + -1;
                } while (iVar14 != 0);
              }
              sVar8 = fread(&local_a0,4,1,local_b0);
              if (sVar8 != 1) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0x9a7,"ref_part_plt_data","dim",1,sVar8);
                return 1;
              }
              iVar14 = nvar;
              if (0 < nvar && local_a0 == 1) {
                do {
                  sVar8 = fread(&local_a0,4,1,local_b0);
                  iVar4 = local_a0;
                  if (sVar8 != 1) {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0x9aa,"ref_part_plt_data","dim",1,sVar8);
                    return 1;
                  }
                  if ((long)local_a0 != -1) {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0x9ab,"ref_part_plt_data","variable sharing not implemented plt",
                           0xffffffffffffffff,(long)local_a0);
                    uVar6 = 1;
                  }
                  if (iVar4 != -1) {
                    return uVar6;
                  }
                  iVar14 = iVar14 + -1;
                } while (iVar14 != 0);
              }
              sVar8 = fread(&local_60,4,1,local_b0);
              if (sVar8 != 1) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0x9ae,"ref_part_plt_data","dim",1,sVar8);
                return 1;
              }
              if ((long)local_60 != -1) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0x9af,"ref_part_plt_data","connectivity sharing not implemented plt",
                       0xffffffffffffffff,(long)local_60);
                uVar6 = 1;
              }
              if (local_60 != -1) {
                return uVar6;
              }
              iVar14 = nvar;
              if (0 < nvar) {
                do {
                  sVar8 = fread(local_38,8,1,local_b0);
                  if (sVar8 != 1) {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0x9b2,"ref_part_plt_data","dim",1,sVar8);
                    return 1;
                  }
                  sVar8 = fread(local_40,8,1,local_b0);
                  if (sVar8 != 1) {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0x9b3,"ref_part_plt_data","dim",1,sVar8);
                    return 1;
                  }
                  iVar14 = iVar14 + -1;
                } while (iVar14 != 0);
              }
              if (-1 < local_a8 * nvar) {
                pRVar9 = (REF_DBL *)malloc((ulong)(uint)(local_a8 * nvar) << 3);
                *soln = pRVar9;
                if (pRVar9 == (REF_DBL *)0x0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0x9b6,"ref_part_plt_data","malloc *soln of REF_DBL NULL");
                  return 2;
                }
                if (local_68 == 0) {
                  if (0 < nvar) {
                    local_78 = (ulong)(uint)nvar;
                    local_98 = local_78 * 8;
                    local_90 = 0;
                    uVar12 = 0;
                    do {
                      if (0 < local_a8) {
                        lVar13 = 0;
                        lVar15 = local_90;
                        do {
                          local_b4 = local_80->value[uVar12];
                          if (local_b4 == 2) {
                            sVar8 = fread(&local_70,8,1,local_b0);
                            dVar16 = local_70;
                            if (sVar8 != 1) {
                              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                     ,0x9c3,"ref_part_plt_data","double",1,sVar8);
                              return 1;
                            }
                          }
                          else {
                            if (local_b4 != 1) {
                              printf("dataformat = %d\n",(ulong)local_b4);
                              uVar10 = 0x9c8;
                              goto LAB_0018e0e5;
                            }
                            sVar8 = fread(&local_a4,4,1,local_b0);
                            if (sVar8 != 1) {
                              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                     ,0x9bf,"ref_part_plt_data","float",1,sVar8);
                              return 1;
                            }
                            dVar16 = (double)local_a4;
                          }
                          *(double *)((long)*soln + lVar15) = dVar16;
                          lVar13 = lVar13 + 1;
                          lVar15 = lVar15 + local_98;
                        } while (lVar13 < local_a8);
                      }
                      uVar12 = uVar12 + 1;
                      local_90 = local_90 + 8;
                    } while (uVar12 != local_78);
                  }
                }
                else if (0 < local_a8) {
                  local_98 = (ulong)(uint)nvar;
                  local_78 = local_98 * 8;
                  lVar15 = 0;
                  local_90 = 0;
                  do {
                    if (0 < nvar) {
                      uVar12 = 0;
                      do {
                        local_b4 = local_80->value[uVar12];
                        if (local_b4 != 2) {
                          if (local_b4 == 1) {
                            sVar8 = fread(&local_a4,4,1,local_b0);
                            if (sVar8 != 1) {
                              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                     ,0x9d2,"ref_part_plt_data","float",1,sVar8);
                              return 1;
                            }
                            dVar16 = (double)local_a4;
                            goto LAB_0018dd5d;
                          }
                          printf("dataformat = %d\n",(ulong)local_b4);
                          uVar10 = 0x9db;
LAB_0018e0e5:
                          uVar6 = 6;
                          pcVar11 = "implement tecplot plt dataformat read";
                          uVar12 = 6;
                          goto LAB_0018d4e9;
                        }
                        sVar8 = fread(&local_70,8,1,local_b0);
                        dVar16 = local_70;
                        if (sVar8 != 1) {
                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                 ,0x9d6,"ref_part_plt_data","double",1,sVar8);
                          return 1;
                        }
LAB_0018dd5d:
                        *(double *)((long)*soln + uVar12 * 8 + lVar15) = dVar16;
                        uVar12 = uVar12 + 1;
                      } while (local_98 != uVar12);
                    }
                    local_90 = local_90 + 1;
                    lVar15 = lVar15 + local_78;
                  } while (local_90 < local_a8);
                }
                if (0 < local_84) {
                  local_98 = local_98 & 0xffffffff00000000;
                  do {
                    iVar14 = (int)local_58;
                    do {
                      sVar8 = fread(local_44,4,1,local_b0);
                      if (sVar8 != 1) {
                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                               ,0x9e3,"ref_part_plt_data","dim",1,sVar8);
                        return 1;
                      }
                      iVar14 = iVar14 + -1;
                    } while (iVar14 != 0);
                    iVar14 = (int)local_98 + 1;
                    local_98 = CONCAT44(local_98._4_4_,iVar14);
                  } while (iVar14 < local_84);
                }
                ref_list_free(local_80);
                return 0;
              }
              pcVar11 = "malloc *soln of REF_DBL negative";
              uVar10 = 0x9b6;
            }
            else {
              printf("zonetype = %d\n");
              pcVar11 = "unknown tecplot plt zonetype read";
              uVar10 = 0x991;
            }
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   uVar10,"ref_part_plt_data",pcVar11);
            uVar6 = 1;
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x97d,"ref_part_plt_data",(ulong)uVar6,"zone elem size");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0x97c,"ref_part_plt_data",(ulong)uVar6,"zone node size");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x97b,"ref_part_plt_data",(ulong)uVar6,"zone packing");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x97a,
             "ref_part_plt_data",(ulong)uVar6,"zonetype");
    }
  }
  else {
    pcVar11 = "dataformats";
    uVar10 = 0x978;
    uVar12 = (ulong)uVar6;
LAB_0018d4e9:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar10,
           "ref_part_plt_data",uVar12,pcVar11);
  }
  return uVar6;
}

Assistant:

REF_FCN static REF_STATUS ref_part_plt_data(
    FILE *file, REF_INT nvar, REF_LIST zone_type, REF_LIST zone_packing,
    REF_LIST zone_nnode, REF_LIST zone_nelem, REF_INT *length, REF_DBL **soln) {
  float zonemarker;
  int dataformat;
  REF_INT i, node, elem, node_per;
  int passive, sharing, conn, c2n;
  double minval, maxval;
  REF_INT zonetype, packing, nnode, nelem;
  float var_float;
  double var_double;
  REF_LIST dataformats = NULL;
  REF_BOOL verbose = REF_FALSE;

  RSS(ref_list_create(&dataformats), "dataformats");

  RSS(ref_list_shift(zone_type, &zonetype), "zonetype");
  RSS(ref_list_shift(zone_packing, &packing), "zone packing");
  RSS(ref_list_shift(zone_nnode, &nnode), "zone node size");
  RSS(ref_list_shift(zone_nelem, &nelem), "zone elem size");

  switch (zonetype) {
    case 1: /* FELINESEG */
      node_per = 2;
      break;
    case 2: /* FETRIANGLE */
      node_per = 3;
      break;
    case 3: /* FEQUADRILATERAL */
      node_per = 4;
      break;
    case 4: /* FETETRAHEDRON */
      node_per = 4;
      break;
    case 5: /* FEBRICK */
      node_per = 8;
      break;
    default:
      printf("zonetype = %d\n", zonetype);
      THROW("unknown tecplot plt zonetype read");
  }
  if (verbose)
    printf("zone type %d node_per %d packing %d nnode %d nelem %d\n", zonetype,
           node_per, packing, nnode, nelem);

  *length = nnode;

  REIS(1, fread(&zonemarker, sizeof(float), 1, file), "zonemarker");
  RWDS(299.0, (double)zonemarker, -1.0, "start of data header expected");

  for (i = 0; i < nvar; i++) {
    REIS(1, fread(&dataformat, sizeof(int), 1, file), "dim");
    RSS(ref_list_push(dataformats, dataformat), "save dataformat");
  }
  REIS(1, fread(&passive, sizeof(int), 1, file), "dim");
  if (1 == passive) {
    for (i = 0; i < nvar; i++) {
      REIS(1, fread(&passive, sizeof(int), 1, file), "dim");
      REIS(0, passive, "passive variable nonzero plt");
    }
  }
  REIS(1, fread(&sharing, sizeof(int), 1, file), "dim");
  if (1 == sharing) {
    for (i = 0; i < nvar; i++) {
      REIS(1, fread(&sharing, sizeof(int), 1, file), "dim");
      REIS(-1, sharing, "variable sharing not implemented plt");
    }
  }
  REIS(1, fread(&conn, sizeof(int), 1, file), "dim");
  REIS(-1, conn, "connectivity sharing not implemented plt");

  for (i = 0; i < nvar; i++) {
    REIS(1, fread(&minval, sizeof(double), 1, file), "dim");
    REIS(1, fread(&maxval, sizeof(double), 1, file), "dim");
  }

  ref_malloc(*soln, nvar * nnode, REF_DBL);

  /* Data packing. 0 = Block 1 = Point */
  if (0 == packing) {
    for (i = 0; i < nvar; i++) {
      for (node = 0; node < nnode; node++) {
        dataformat = ref_list_value(dataformats, i);
        switch (dataformat) {
          case 1: /* float */
            REIS(1, fread(&var_float, sizeof(float), 1, file), "float");
            (*soln)[i + nvar * node] = (double)var_float;
            break;
          case 2: /* double */
            REIS(1, fread(&var_double, sizeof(double), 1, file), "double");
            (*soln)[i + nvar * node] = var_double;
            break;
          default:
            printf("dataformat = %d\n", dataformat);
            RSS(REF_IMPLEMENT, "implement tecplot plt dataformat read");
        }
      }
    }
  } else {
    for (node = 0; node < nnode; node++) {
      for (i = 0; i < nvar; i++) {
        dataformat = ref_list_value(dataformats, i);
        switch (dataformat) {
          case 1: /* float */
            REIS(1, fread(&var_float, sizeof(float), 1, file), "float");
            (*soln)[i + nvar * node] = (double)var_float;
            break;
          case 2: /* double */
            REIS(1, fread(&var_double, sizeof(double), 1, file), "double");
            (*soln)[i + nvar * node] = var_double;
            break;
          default:
            printf("dataformat = %d\n", dataformat);
            RSS(REF_IMPLEMENT, "implement tecplot plt dataformat read");
        }
      }
    }
  }

  for (elem = 0; elem < nelem; elem++) {
    for (i = 0; i < node_per; i++) {
      REIS(1, fread(&c2n, sizeof(int), 1, file), "dim");
    }
  }

  ref_list_free(dataformats);

  return REF_SUCCESS;
}